

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_map.c
# Opt level: O2

int log_map_destroy(log_map map)

{
  log_map_bucket_conflict *__ptr;
  size_t iterator;
  ulong uVar1;
  
  if (map != (log_map)0x0) {
    free((map->table).data);
    if ((map->block).data != (log_map_bucket_conflict *)0x0) {
      for (uVar1 = 0; __ptr = (map->block).data, uVar1 < (map->block).count; uVar1 = uVar1 + 1) {
        free(__ptr[uVar1]);
      }
      free(__ptr);
    }
    free(map);
    return 0;
  }
  return 1;
}

Assistant:

int log_map_destroy(log_map map)
{
	if (map == NULL)
	{
		return 1;
	}

	if (map->table.data != NULL)
	{
		free(map->table.data);
	}

	if (map->block.data != NULL)
	{
		size_t iterator;

		for (iterator = 0; iterator < map->block.count; ++iterator)
		{
			if (map->block.data[iterator] != NULL)
			{
				free(map->block.data[iterator]);
			}
		}

		free(map->block.data);
	}

	free(map);

	return 0;
}